

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5NodeCompare(Fts5Expr *pExpr,Fts5ExprNode *p1,Fts5ExprNode *p2)

{
  int iVar1;
  
  if (p2->bEof == 0) {
    if (p1->bEof == 0) {
      iVar1 = fts5RowidCmp(pExpr,p1->iRowid,p2->iRowid);
      return iVar1;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int fts5NodeCompare(
  Fts5Expr *pExpr,
  Fts5ExprNode *p1, 
  Fts5ExprNode *p2
){
  if( p2->bEof ) return -1;
  if( p1->bEof ) return +1;
  return fts5RowidCmp(pExpr, p1->iRowid, p2->iRowid);
}